

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.cpp
# Opt level: O0

void write_sei_rbsp(h264_stream_t *h,bs_t *b)

{
  int local_1c;
  int i;
  bs_t *b_local;
  h264_stream_t *h_local;
  
  for (local_1c = 0; local_1c < h->num_seis; local_1c = local_1c + 1) {
    h->sei = h->seis[local_1c];
    write_sei_message(h,b);
  }
  h->sei = (sei_t *)0x0;
  write_rbsp_trailing_bits(h,b);
  return;
}

Assistant:

void write_sei_rbsp(h264_stream_t* h, bs_t* b)
{
    int i;
    for (i = 0; i < h->num_seis; i++)
    {
        h->sei = h->seis[i];
        write_sei_message(h, b);
    }
    //since hei is temp, let seis list free what needs to be freed
    //and leave sei null
    h->sei = NULL;
    write_rbsp_trailing_bits(h, b);
}